

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O1

_Bool run_container_remove(run_container_t *run,uint16_t pos)

{
  ushort uVar1;
  int iVar2;
  ushort uVar3;
  bool bVar4;
  rle16_t *prVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint unaff_R14D;
  rle16_t rVar10;
  
  prVar5 = run->runs;
  iVar2 = run->n_runs;
  iVar9 = iVar2 + -1;
  uVar8 = 0;
  do {
    if (iVar9 < (int)uVar8) {
      uVar7 = ~uVar8;
      break;
    }
    uVar7 = uVar8 + iVar9 >> 1;
    if (prVar5[uVar7].value < pos) {
      uVar8 = uVar7 + 1;
      bVar4 = true;
      uVar7 = unaff_R14D;
    }
    else if (pos < prVar5[uVar7].value) {
      iVar9 = uVar7 - 1;
      bVar4 = true;
      uVar7 = unaff_R14D;
    }
    else {
      bVar4 = false;
    }
    unaff_R14D = uVar7;
  } while (bVar4);
  if ((int)uVar7 < 0) {
    if (uVar7 == 0xffffffff) {
      return false;
    }
    uVar6 = (ulong)(-uVar7 - 2);
    uVar8 = (uint)pos - (uint)prVar5[uVar6].value;
    uVar1 = prVar5[uVar6].length;
    if ((int)uVar8 < (int)(uint)uVar1) {
      prVar5[uVar6].length = (ushort)uVar8 - 1;
      if (run->capacity <= iVar2) {
        run_container_grow(run,iVar2 + 1,true);
      }
      uVar6 = (ulong)(~uVar7 & 0xffff);
      memmove(run->runs + uVar6 + 1,run->runs + uVar6,((long)run->n_runs - uVar6) * 4);
      run->n_runs = run->n_runs + 1;
      prVar5 = run->runs;
      uVar6 = (ulong)~uVar7;
      prVar5[uVar6].value = pos + 1;
      uVar3 = ~(ushort)uVar8;
    }
    else {
      if (uVar8 != uVar1) {
        return false;
      }
      uVar3 = 0xffff;
    }
    prVar5[uVar6].length = uVar1 + uVar3;
  }
  else if (prVar5[uVar7].length == 0) {
    uVar7 = uVar7 & 0xffff;
    memmove(prVar5 + uVar7,prVar5 + (ulong)uVar7 + 1,(long)(int)(iVar2 + ~uVar7) << 2);
    run->n_runs = run->n_runs + -1;
  }
  else {
    rVar10.value = prVar5[uVar7].value + 1;
    rVar10.length = prVar5[uVar7].length - 1;
    prVar5[uVar7] = rVar10;
  }
  return true;
}

Assistant:

static inline bool run_container_remove(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) {
        int32_t le = run->runs[index].length;
        if (le == 0) {
            recoverRoomAtIndex(run, (uint16_t)index);
        } else {
            run->runs[index].value++;
            run->runs[index].length--;
        }
        return true;
    }
    index = -index - 2;  // points to preceding value, possibly -1
    if (index >= 0) {    // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset < le) {
            // need to break in two
            run->runs[index].length = (uint16_t)(offset - 1);
            // need to insert
            uint16_t newvalue = pos + 1;
            int32_t newlength = le - offset - 1;
            makeRoomAtIndex(run, (uint16_t)(index + 1));
            run->runs[index + 1].value = newvalue;
            run->runs[index + 1].length = (uint16_t)newlength;
            return true;

        } else if (offset == le) {
            run->runs[index].length--;
            return true;
        }
    }
    // no match
    return false;
}